

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O0

void __thiscall
sc_core::sc_trace_file_base::set_time_unit(sc_trace_file_base *this,double v,sc_time_unit tu)

{
  ostream *poVar1;
  value_type vVar2;
  ulong uVar3;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  undefined1 auVar5 [16];
  stringstream ss_1;
  stringstream ss;
  sc_time_unit in_stack_fffffffffffffc1c;
  string local_398 [32];
  string local_378 [12];
  int in_stack_fffffffffffffc94;
  char *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  sc_severity in_stack_fffffffffffffcb4;
  ostream local_348 [376];
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [72];
  unit_type in_stack_fffffffffffffeb8;
  
  if ((*(byte *)(in_RDI + 0xb8) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x90) = 1;
    vVar2 = unit_to_fs(in_stack_fffffffffffffc1c);
    auVar5._8_4_ = (int)(vVar2 >> 0x20);
    auVar5._0_8_ = vVar2;
    auVar5._12_4_ = 0x45300000;
    dVar4 = in_XMM0_Qa *
            ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)vVar2) - 4503599627370496.0));
    uVar3 = (ulong)dVar4;
    *(ulong *)(in_RDI + 0x80) = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffca8);
    fs_unit_to_str_abi_cxx11_(in_stack_fffffffffffffeb8);
    poVar1 = std::operator<<(local_348,local_378);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x98));
    std::operator<<(poVar1,")");
    std::__cxx11::string::~string(local_378);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sc_report_handler::report
              (in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98,in_stack_fffffffffffffc94);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffca8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,(string *)(in_RDI + 0x98));
    std::operator<<(poVar1,
                    "\n\tTimescale unit cannot be changed once tracing has begun.\n\tTo change the scale, create a new trace file."
                   );
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sc_report_handler::report
              (in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98,in_stack_fffffffffffffc94);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void
sc_trace_file_base::set_time_unit( double v, sc_time_unit tu )
{
    if( initialized_ )
    {
        std::stringstream ss;
        ss << filename_ << "\n"
           "\tTimescale unit cannot be changed once tracing has begun.\n"
           "\tTo change the scale, create a new trace file.";
        SC_REPORT_ERROR( SC_ID_TRACING_ALREADY_INITIALIZED_
                       , ss.str().c_str() );
        return;
    }

    timescale_set_by_user = true;
    trace_unit_fs = static_cast<unit_type>(v * unit_to_fs(tu));

    // EMIT ADVISORY MESSAGE ABOUT CHANGE IN TIME SCALE:
    {
      std::stringstream ss;
      ss << fs_unit_to_str(trace_unit_fs)
         << " (" << filename_ << ")";
      SC_REPORT_INFO( SC_ID_TRACING_TIMESCALE_UNIT_, ss.str().c_str() );
    }
}